

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O1

void __thiscall tcu::x11::glx::GlxWindow::getDimensions(GlxWindow *this,int *width,int *height)

{
  int iVar1;
  int iVar2;
  uint value;
  uint value_1;
  int local_30;
  int local_2c;
  
  if (width != (int *)0x0) {
    local_30 = 0;
    iVar1 = (*(this->super_GlxDrawable)._vptr_GlxDrawable[4])(this);
    iVar2 = (*(this->super_GlxDrawable)._vptr_GlxDrawable[5])(this);
    glXQueryDrawable(iVar1,iVar2,0x801d,&local_30);
    *width = local_30;
  }
  if (height != (int *)0x0) {
    local_2c = 0;
    iVar1 = (*(this->super_GlxDrawable)._vptr_GlxDrawable[4])(this);
    iVar2 = (*(this->super_GlxDrawable)._vptr_GlxDrawable[5])(this);
    glXQueryDrawable(iVar1,iVar2,0x801e,&local_2c);
    *height = local_2c;
  }
  if (((width != (int *)0x0) && (*width == 0)) || ((height != (int *)0x0 && (*height == 0)))) {
    XlibWindow::getDimensions(&this->m_x11Window,width,height);
  }
  return;
}

Assistant:

void GlxWindow::getDimensions (int* width, int* height)
{
	if (width != DE_NULL)
		*width = getAttrib(GLX_WIDTH);
	if (height != DE_NULL)
		*height = getAttrib(GLX_HEIGHT);

	// glXQueryDrawable may be buggy, so fall back to X geometry if needed
	if ((width != DE_NULL && *width == 0) || (height != DE_NULL && *height == 0))
		m_x11Window.getDimensions(width, height);
}